

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O1

Result __thiscall wabt::anon_unknown_7::Validator::EndIfExpr(Validator *this,IfExpr *expr)

{
  Location *pLVar1;
  
  pLVar1 = &expr->false_end_loc;
  if ((expr->false_).size_ == 0) {
    pLVar1 = &(expr->true_).end_loc;
  }
  this->expr_loc_ = pLVar1;
  TypeChecker::OnEnd(&this->typechecker_);
  return (Result)Ok;
}

Assistant:

Result Validator::EndIfExpr(IfExpr* expr) {
  expr_loc_ =
      expr->false_.empty() ? &expr->true_.end_loc : &expr->false_end_loc;
  typechecker_.OnEnd();
  return Result::Ok;
}